

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateHeapType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  TypeBuilder *pTVar1;
  Random *this_00;
  bool bVar2;
  int iVar3;
  BasicHeapType BVar4;
  uint32_t uVar5;
  reference pvVar6;
  value_type_conflict3 *pvVar7;
  Entry local_88;
  Entry local_78;
  undefined4 local_68;
  Entry local_58;
  uintptr_t local_48;
  uint local_40;
  value_type_conflict3 local_3c;
  Index n;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> eligible;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = share;
  bVar2 = Random::oneIn(this->rand,4);
  if (bVar2) {
    BVar4 = generateBasicHeapType
                      (this,eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    HeapType::HeapType((HeapType *)&this_local,BVar4);
  }
  else if (eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ == Shared) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
    local_3c = 0;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->recGroupEnds,(ulong)this->index);
    local_40 = *pvVar6;
    for (; local_3c < local_40; local_3c = local_3c + 1) {
      local_58 = TypeBuilder::operator[](this->builder,(ulong)local_3c);
      local_48 = (uintptr_t)TypeBuilder::Entry::operator_cast_to_HeapType(&local_58);
      iVar3 = ::wasm::HeapType::getShared();
      if (iVar3 == 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n,&local_3c);
      }
    }
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
    if (bVar2) {
      BVar4 = generateBasicHeapType
                        (this,eligible.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      HeapType::HeapType((HeapType *)&this_local,BVar4);
    }
    else {
      pTVar1 = this->builder;
      pvVar7 = Random::pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         (this->rand,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
      local_78 = TypeBuilder::operator[](pTVar1,(ulong)*pvVar7);
      this_local = (HeapTypeGeneratorImpl *)TypeBuilder::Entry::operator_cast_to_HeapType(&local_78)
      ;
    }
    local_68 = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
  }
  else {
    pTVar1 = this->builder;
    this_00 = this->rand;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->recGroupEnds,(ulong)this->index);
    uVar5 = Random::upTo(this_00,*pvVar6);
    local_88 = TypeBuilder::operator[](pTVar1,(ulong)uVar5);
    this_local = (HeapTypeGeneratorImpl *)TypeBuilder::Entry::operator_cast_to_HeapType(&local_88);
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType generateHeapType(Shareability share) {
    if (rand.oneIn(4)) {
      return generateBasicHeapType(share);
    }
    if (share == Shared) {
      // We can only reference other shared types.
      std::vector<Index> eligible;
      for (Index i = 0, n = recGroupEnds[index]; i < n; ++i) {
        if (HeapType(builder[i]).getShared() == Shared) {
          eligible.push_back(i);
        }
      }
      if (eligible.empty()) {
        return generateBasicHeapType(share);
      }
      return builder[rand.pick(eligible)];
    }
    // Any heap type can be referenced in an unshared context.
    return builder[rand.upTo(recGroupEnds[index])];
  }